

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

uint32_t __thiscall
slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true>::
insertFrom(LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true> *this,uint32_t i,
          uint32_t size,interval<unsigned_long> *key,Expression **value)

{
  uint uVar1;
  interval<unsigned_long> *piVar2;
  interval<unsigned_long> *piVar3;
  unsigned_long uVar4;
  uint uVar5;
  uint32_t uVar6;
  
  uVar6 = 6;
  if (i != 5) {
    if (i != size) {
      uVar5 = size;
      if (size == 5) {
        return 6;
      }
      do {
        uVar1 = uVar5 - 1;
        piVar2 = (this->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                 ).first + uVar1;
        uVar4 = piVar2->right;
        piVar3 = (this->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                 ).first + uVar5;
        piVar3->left = piVar2->left;
        piVar3->right = uVar4;
        (this->
        super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
        ).second[uVar5] =
             (this->
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
             ).second[uVar1];
        uVar5 = uVar1;
      } while (i != uVar1);
    }
    uVar4 = key->right;
    piVar2 = (this->
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
             ).first + i;
    piVar2->left = key->left;
    piVar2->right = uVar4;
    (this->
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
    ).second[i] = *value;
    uVar6 = size + 1;
  }
  return uVar6;
}

Assistant:

uint32_t LeafNode<TKey, TValue, Capacity, _IsRoot>::insertFrom(uint32_t i, uint32_t size,
                                                               const interval<TKey>& key,
                                                               const TValue& value) {
    SLANG_ASSERT(i <= size && size <= Capacity);
    SLANG_ASSERT(key.left <= key.right);
    SLANG_ASSERT(i == 0 || keyAt(i - 1).left < key.left);
    SLANG_ASSERT(i == size || !(keyAt(i).left < key.left));

    // If we're at capacity we can't insert another element.
    if (i == Capacity)
        return Capacity + 1;

    if (i != size) {
        // We're inserting in the middle -- make sure we have room.
        if (size == Capacity)
            return Capacity + 1;

        this->moveRight(i, i + 1, size - i);
    }

    this->first[i] = key;
    this->second[i] = value;
    return size + 1;
}